

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

void prvTidyTakeConfigSnapshot(TidyDocImpl *doc)

{
  TidyOptionValue *snap;
  TidyOptionValue *value;
  TidyOptionImpl *option;
  uint ixVal;
  TidyDocImpl *doc_local;
  
  value = (TidyOptionValue *)option_defs;
  option._4_4_ = 0;
  while( true ) {
    if (0x67 < option._4_4_) {
      return;
    }
    if (option._4_4_ != *(uint *)value) break;
    CopyOptionValue(doc,(TidyOptionImpl *)value,(doc->config).snapshot + option._4_4_,
                    (doc->config).value + option._4_4_);
    value = value + 7;
    option._4_4_ = option._4_4_ + 1;
  }
  __assert_fail("ixVal == (uint) option->id",
                "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/config.c",
                0x2d2,"void prvTidyTakeConfigSnapshot(TidyDocImpl *)");
}

Assistant:

void TY_(TakeConfigSnapshot)( TidyDocImpl* doc )
{
    uint ixVal;
    const TidyOptionImpl* option = option_defs;
    const TidyOptionValue* value = &doc->config.value[ 0 ];
    TidyOptionValue* snap  = &doc->config.snapshot[ 0 ];

    /* @jsd: do NOT mess with user-specified settings until
     *       absolutely necessary, and ensure that we can
     *       can restore them immediately after the need.
     */
    // TY_(AdjustConfig)( doc );  /* Make sure it's consistent */
    for ( ixVal=0; ixVal < N_TIDY_OPTIONS; ++option, ++ixVal )
    {
        assert( ixVal == (uint) option->id );
        CopyOptionValue( doc, option, &snap[ixVal], &value[ixVal] );
    }
}